

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::
find_or_prepare_insert_non_soo<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
          *this,pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *key)

{
  char *pcVar1;
  long lVar2;
  ushort uVar3;
  bool bVar4;
  char cVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  size_t hash;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i match;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar12 [16];
  iterator iVar28;
  FindInfo FVar29;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  ulong local_70;
  EqualElement<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  hash = hash_internal::MixingHashState::
         hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_0>
                   (key);
  probe(&local_88,(CommonFields *)this,hash);
  lVar2 = *(long *)(this + 0x10);
  auVar10 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar10 = pshuflw(auVar10,auVar10,0);
  uVar9 = auVar10._0_4_;
  auVar10._4_4_ = uVar9;
  auVar10._0_4_ = uVar9;
  auVar10._8_4_ = uVar9;
  auVar10._12_4_ = uVar9;
  do {
    pcVar1 = (char *)(lVar2 + local_88.offset_);
    auVar11[0] = -(auVar10[0] == *pcVar1);
    auVar11[1] = -(auVar10[1] == pcVar1[1]);
    auVar11[2] = -(auVar10[2] == pcVar1[2]);
    auVar11[3] = -(auVar10[3] == pcVar1[3]);
    auVar11[4] = -(auVar10[4] == pcVar1[4]);
    auVar11[5] = -(auVar10[5] == pcVar1[5]);
    auVar11[6] = -(auVar10[6] == pcVar1[6]);
    auVar11[7] = -(auVar10[7] == pcVar1[7]);
    auVar11[8] = -(auVar10[8] == pcVar1[8]);
    auVar11[9] = -(auVar10[9] == pcVar1[9]);
    auVar11[10] = -(auVar10[10] == pcVar1[10]);
    auVar11[0xb] = -(auVar10[0xb] == pcVar1[0xb]);
    auVar11[0xc] = -(auVar10[0xc] == pcVar1[0xc]);
    auVar11[0xd] = -(auVar10[0xd] == pcVar1[0xd]);
    auVar11[0xe] = -(auVar10[0xe] == pcVar1[0xe]);
    auVar11[0xf] = -(auVar10[0xf] == pcVar1[0xf]);
    cVar5 = *pcVar1;
    cVar13 = pcVar1[1];
    cVar14 = pcVar1[2];
    cVar15 = pcVar1[3];
    cVar16 = pcVar1[4];
    cVar17 = pcVar1[5];
    cVar18 = pcVar1[6];
    cVar19 = pcVar1[7];
    cVar20 = pcVar1[8];
    cVar21 = pcVar1[9];
    cVar22 = pcVar1[10];
    cVar23 = pcVar1[0xb];
    cVar24 = pcVar1[0xc];
    cVar25 = pcVar1[0xd];
    cVar26 = pcVar1[0xe];
    cVar27 = pcVar1[0xf];
    for (uVar6 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
        ; uVar6 != 0; uVar6 = uVar6 - 1 & uVar6) {
      local_70 = hash;
      local_58 = cVar5;
      cStack_57 = cVar13;
      cStack_56 = cVar14;
      cStack_55 = cVar15;
      cStack_54 = cVar16;
      cStack_53 = cVar17;
      cStack_52 = cVar18;
      cStack_51 = cVar19;
      cStack_50 = cVar20;
      cStack_4f = cVar21;
      cStack_4e = cVar22;
      cStack_4d = cVar23;
      cStack_4c = cVar24;
      cStack_4b = cVar25;
      cStack_4a = cVar26;
      cStack_49 = cVar27;
      local_48 = auVar10;
      uVar7 = TrailingZeros<unsigned_short>(uVar6);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar4 = DecomposePair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>::EqualElement<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>&>
                        (&local_68,
                         (pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>
                          *)((local_88.offset_ + uVar7 & local_88.mask_) * 0x20 +
                            *(long *)(this + 0x18)));
      if (bVar4) {
        local_88.mask_ = uVar7 + local_88.offset_ & local_88.mask_;
        bVar4 = false;
        goto LAB_001edf00;
      }
      hash = local_70;
      auVar10 = local_48;
      cVar5 = local_58;
      cVar13 = cStack_57;
      cVar14 = cStack_56;
      cVar15 = cStack_55;
      cVar16 = cStack_54;
      cVar17 = cStack_53;
      cVar18 = cStack_52;
      cVar19 = cStack_51;
      cVar20 = cStack_50;
      cVar21 = cStack_4f;
      cVar22 = cStack_4e;
      cVar23 = cStack_4d;
      cVar24 = cStack_4c;
      cVar25 = cStack_4b;
      cVar26 = cStack_4a;
      cVar27 = cStack_49;
    }
    auVar12[0] = -(cVar5 == -0x80);
    auVar12[1] = -(cVar13 == -0x80);
    auVar12[2] = -(cVar14 == -0x80);
    auVar12[3] = -(cVar15 == -0x80);
    auVar12[4] = -(cVar16 == -0x80);
    auVar12[5] = -(cVar17 == -0x80);
    auVar12[6] = -(cVar18 == -0x80);
    auVar12[7] = -(cVar19 == -0x80);
    auVar12[8] = -(cVar20 == -0x80);
    auVar12[9] = -(cVar21 == -0x80);
    auVar12[10] = -(cVar22 == -0x80);
    auVar12[0xb] = -(cVar23 == -0x80);
    auVar12[0xc] = -(cVar24 == -0x80);
    auVar12[0xd] = -(cVar25 == -0x80);
    auVar12[0xe] = -(cVar26 == -0x80);
    auVar12[0xf] = -(cVar27 == -0x80);
    uVar6 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf;
    if (uVar6 != 0) {
      cVar5 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (*(ulong *)this,hash,*(ctrl_t **)(this + 0x10));
      if (cVar5 == '\0') {
        uVar8 = TrailingZeros<unsigned_short>(uVar6);
      }
      else {
        uVar3 = 0xf;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar8 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      FVar29.offset = uVar8 + local_88.offset_ & local_88.mask_;
      FVar29.probe_length = local_88.index_;
      local_88.mask_ =
           absl::lts_20240722::container_internal::PrepareInsertNonSoo
                     ((CommonFields *)this,hash,FVar29,
                      (PolicyFunctions *)GetPolicyFunctions()::value);
      bVar4 = true;
LAB_001edf00:
      iVar28 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this,local_88.mask_);
      __return_storage_ptr__->first = iVar28;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    local_88.index_ = local_88.index_ + 0x10;
    local_88.offset_ = local_88.offset_ + local_88.index_ & local_88.mask_;
    if (*(ulong *)this < local_88.index_) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, K = std::pair<const void *, std::basic_string_view<char>>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }